

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

void __thiscall
QSocks5SocketEnginePrivate::_q_udpSocketReadNotification(QSocks5SocketEnginePrivate *this)

{
  QUdpSocket *this_00;
  Data *pDVar1;
  qsizetype qVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  qint64 qVar7;
  char *pcVar8;
  QQueue<QSocks5RevivedDatagram> *this_01;
  long in_FS_OFFSET;
  int pos;
  QByteArray local_c8;
  int local_ac;
  QByteArray local_a8;
  QByteArray local_88;
  undefined1 local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = QUdpSocket::hasPendingDatagrams(this->udpData->udpSocket);
  if (bVar5) {
    do {
      bVar5 = QUdpSocket::hasPendingDatagrams(this->udpData->udpSocket);
      if (!bVar5) {
        emitReadNotification(this);
        break;
      }
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      qVar7 = QUdpSocket::pendingDatagramSize(this->udpData->udpSocket);
      QByteArray::QByteArray(&local_88,qVar7,'\0');
      this_00 = this->udpData->udpSocket;
      if ((&(local_88.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData((longlong)&local_88,(AllocationOption)local_88.d.size);
      }
      bVar5 = false;
      QUdpSocket::readDatagram
                (this_00,local_88.d.ptr,local_88.d.size,(QHostAddress *)0x0,(quint16 *)0x0);
      local_a8.d.d = (Data *)0x0;
      local_a8.d.ptr = (char *)0x0;
      local_a8.d.size = 0;
      QByteArray::operator=(&local_a8,&local_88);
      local_ac = 0;
      pcVar8 = local_a8.d.ptr;
      if (local_a8.d.ptr == (char *)0x0) {
        pcVar8 = (char *)&QByteArray::_empty;
      }
      if (3 < (ulong)local_a8.d.size) {
        local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_8_ = (QArrayData *)0x0;
        local_68._8_8_ = (char *)0x0;
        local_68._16_8_ = 0;
        QHostAddress::QHostAddress((QHostAddress *)(local_68 + 0x18));
        local_68._32_8_ = local_68._32_8_ & 0xffffffffffff0000;
        local_ac = 1;
        if ((((*pcVar8 == '\0') && (local_ac = 2, pcVar8[1] == '\0')) &&
            (local_ac = 3, pcVar8[2] == '\0')) &&
           (iVar6 = qt_socks5_get_host_address_and_port
                              (&local_a8,(QHostAddress *)(local_68 + 0x18),
                               (quint16 *)(local_68 + 0x20),&local_ac), iVar6 == 1)) {
          QByteArray::QByteArray(&local_c8,pcVar8 + local_ac,local_a8.d.size - local_ac);
          uVar4 = local_68._8_8_;
          uVar3 = local_68._0_8_;
          qVar2 = local_c8.d.size;
          pDVar1 = local_c8.d.d;
          local_c8.d.d = (Data *)local_68._0_8_;
          local_68._0_8_ = pDVar1;
          local_68._8_8_ = local_c8.d.ptr;
          local_c8.d.ptr = (char *)uVar4;
          local_c8.d.size = local_68._16_8_;
          local_68._16_8_ = qVar2;
          if ((QArrayData *)uVar3 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)uVar3,1,0x10);
            }
          }
          this_01 = &this->udpData->pendingDatagrams;
          QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::
          emplace<QSocks5RevivedDatagram_const&>
                    ((QGenericArrayOps<QSocks5RevivedDatagram> *)this_01,
                     (this->udpData->pendingDatagrams).super_QList<QSocks5RevivedDatagram>.d.size,
                     (QSocks5RevivedDatagram *)local_68);
          QList<QSocks5RevivedDatagram>::end(&this_01->super_QList<QSocks5RevivedDatagram>);
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
        QHostAddress::~QHostAddress((QHostAddress *)(local_68 + 0x18));
        if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68._0_8_,1,0x10);
          }
        }
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
        }
      }
    } while (bVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::_q_udpSocketReadNotification()
{
    QSOCKS5_D_DEBUG << "_q_udpSocketReadNotification()";

    // check some state stuff
    if (!udpData->udpSocket->hasPendingDatagrams()) {
        QSOCKS5_D_DEBUG << "false read ??";
        return;
    }

    while (udpData->udpSocket->hasPendingDatagrams()) {
        QByteArray sealedBuf(udpData->udpSocket->pendingDatagramSize(), 0);
        QSOCKS5_D_DEBUG << "new datagram";
        udpData->udpSocket->readDatagram(sealedBuf.data(), sealedBuf.size());
        QByteArray inBuf;
        if (!data->authenticator->unSeal(sealedBuf, &inBuf)) {
            QSOCKS5_D_DEBUG << "failed unsealing datagram discarding";
            return;
        }
        QSOCKS5_DEBUG << dump(inBuf);
        int pos = 0;
        const char *buf = inBuf.constData();
        if (inBuf.size() < 4) {
            QSOCKS5_D_DEBUG << "bogus udp data, discarding";
            return;
        }
        QSocks5RevivedDatagram datagram;
        if (buf[pos++] != 0 || buf[pos++] != 0) {
            QSOCKS5_D_DEBUG << "invalid datagram discarding";
            return;
        }
        if (buf[pos++] != 0) { //### add fragmentation reading support
            QSOCKS5_D_DEBUG << "don't support fragmentation yet disgarding";
            return;
        }
        if (qt_socks5_get_host_address_and_port(inBuf, &datagram.address, &datagram.port, &pos) != 1) {
            QSOCKS5_D_DEBUG << "failed to get address from datagram disgarding";
            return;
        }
        datagram.data = QByteArray(&buf[pos], inBuf.size() - pos);
        udpData->pendingDatagrams.enqueue(datagram);
    }
    emitReadNotification();
}